

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O2

void anon_unknown.dwarf_899df::createPositiveXEdge<float>
               (vector<float,_std::allocator<float>_> *data,
               vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *point,float x,
               float y)

{
  float *pfVar1;
  PointBase2D<float> local_28;
  
  for (pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pfVar1 != (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish; pfVar1 = pfVar1 + 1) {
    local_28.x = x + *pfVar1;
    local_28.y = y;
    std::vector<PointBase2D<float>,std::allocator<PointBase2D<float>>>::
    emplace_back<PointBase2D<float>>
              ((vector<PointBase2D<float>,std::allocator<PointBase2D<float>>> *)point,&local_28);
  }
  return;
}

Assistant:

void createPositiveXEdge( const std::vector< _Type > & data, std::vector < PointBase2D<_Type> > & point, _Type x, _Type y )
    {
        for ( typename std::vector < _Type >::const_iterator dataX = data.cbegin(); dataX != data.cend(); ++dataX )
            point.push_back( PointBase2D<_Type>( (*dataX) + x, y ) );
    }